

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

void add_zeros_and_len_padding(uchar *output,size_t output_len,size_t data_len)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = output_len - data_len;
  if (1 < uVar2) {
    uVar3 = 1;
    uVar4 = 2;
    do {
      output[uVar3 + (data_len - 1)] = '\0';
      bVar1 = uVar4 < uVar2;
      uVar3 = uVar4;
      uVar4 = (ulong)(byte)((char)uVar4 + 1);
    } while (bVar1);
  }
  output[output_len - 1] = (uchar)uVar2;
  return;
}

Assistant:

static void add_zeros_and_len_padding( unsigned char *output,
                                       size_t output_len, size_t data_len )
{
    size_t padding_len = output_len - data_len;
    unsigned char i = 0;

    for( i = 1; i < padding_len; i++ )
        output[data_len + i - 1] = 0x00;
    output[output_len - 1] = (unsigned char) padding_len;
}